

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::initTestDescriptor
          (TessellationShaderTCTEgl_TessLevel *this,_tessellation_test_type test_type,
          _test_descriptor *out_test_ptr,_tessellation_shader_vertex_spacing vertex_spacing_mode)

{
  undefined8 uVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  GLint GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  char *pcVar7;
  string *psVar8;
  TestLog *this_00;
  MessageBuilder *pMVar9;
  TestError *pTVar10;
  _tessellation_shader_vertex_spacing vertex_spacing;
  char *pcStack_448;
  uint n_varyings;
  char *varyings [2];
  int local_42c;
  undefined1 local_428 [4];
  GLint link_status;
  uint local_2a8;
  int local_2a4;
  GLuint shader;
  GLint compile_status;
  uint n_shader;
  uint n_shaders;
  GLuint shaders [4];
  char *local_280;
  char *vs_body;
  char *te_body_string_raw;
  undefined1 local_250 [8];
  string vertex_spacing_string;
  size_t token_index;
  allocator<char> local_211;
  string local_210 [8];
  string token;
  string te_body_string;
  stringstream te_body_stringstream;
  ostream local_1c0;
  char *local_48;
  char *te_body;
  char *tc_body;
  char *fs_body;
  Functions *gl;
  _test_descriptor *p_Stack_20;
  _tessellation_shader_vertex_spacing vertex_spacing_mode_local;
  _test_descriptor *out_test_ptr_local;
  TessellationShaderTCTEgl_TessLevel *pTStack_10;
  _tessellation_test_type test_type_local;
  TessellationShaderTCTEgl_TessLevel *this_local;
  
  out_test_ptr->type = test_type;
  out_test_ptr->vertex_spacing = vertex_spacing_mode;
  gl._4_4_ = vertex_spacing_mode;
  p_Stack_20 = out_test_ptr;
  out_test_ptr_local._4_4_ = test_type;
  pTStack_10 = this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  fs_body = (char *)CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(fs_body + 0x3c8))();
  p_Stack_20->po_id = GVar3;
  dVar4 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd02);
  GVar3 = (**(code **)(fs_body + 0x3f0))(0x8b30);
  p_Stack_20->fs_id = GVar3;
  GVar3 = (**(code **)(fs_body + 0x3f0))(0x8b31);
  p_Stack_20->vs_id = GVar3;
  if ((out_test_ptr_local._4_4_ == TESSELLATION_TEST_TYPE_FIRST) ||
     (out_test_ptr_local._4_4_ == TESSELLATION_TEST_TYPE_TES)) {
    GVar3 = (**(code **)(fs_body + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
    p_Stack_20->tes_id = GVar3;
  }
  if (out_test_ptr_local._4_4_ == TESSELLATION_TEST_TYPE_FIRST) {
    GVar3 = (**(code **)(fs_body + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
    p_Stack_20->tcs_id = GVar3;
  }
  dVar4 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar4,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd12);
  tc_body = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,p_Stack_20->fs_id,1,&tc_body);
  dVar4 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar4,"glShaderSource() failed for fragment shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd1c);
  te_body = 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 4) out;\n\nuniform vec2 inner_tess_levels;\nuniform vec4 outer_tess_levels;\n\nvoid main()\n{\n    gl_out           [gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    gl_TessLevelInner[0]                           = inner_tess_levels[0];\n    gl_TessLevelInner[1]                           = inner_tess_levels[1];\n    gl_TessLevelOuter[0]                           = outer_tess_levels[0];\n    gl_TessLevelOuter[1]                           = outer_tess_levels[1];\n    gl_TessLevelOuter[2]                           = outer_tess_levels[2];\n    gl_TessLevelOuter[3]                           = outer_tess_levels[3];\n}\n"
  ;
  if (out_test_ptr_local._4_4_ == TESSELLATION_TEST_TYPE_FIRST) {
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,p_Stack_20->tcs_id,1,&te_body);
    dVar4 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar4,"glShaderSource() failed for tessellation control shader object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xd37);
  }
  local_48 = 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (isolines, point_mode, VERTEX_SPACING_MODE) in;\n\nout vec2 result_tess_level_inner;\nout vec4 result_tess_level_outer;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n\n    result_tess_level_inner = vec2(gl_TessLevelInner[0],\n                                   gl_TessLevelInner[1]);\n    result_tess_level_outer = vec4(gl_TessLevelOuter[0],\n                                   gl_TessLevelOuter[1],\n                                   gl_TessLevelOuter[2],\n                                   gl_TessLevelOuter[3]);\n}\n"
  ;
  if ((out_test_ptr_local._4_4_ == TESSELLATION_TEST_TYPE_FIRST) ||
     (out_test_ptr_local._4_4_ == TESSELLATION_TEST_TYPE_TES)) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(te_body_string.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(token.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_210,"VERTEX_SPACING_MODE",&local_211);
    std::allocator<char>::~allocator(&local_211);
    TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
              ((string *)local_250,(TessellationShaderUtils *)(ulong)gl._4_4_,vertex_spacing);
    std::operator<<(&local_1c0,local_48);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=
              ((string *)(token.field_2._M_local_buf + 8),(string *)&te_body_string_raw);
    std::__cxx11::string::~string((string *)&te_body_string_raw);
    vertex_spacing_string.field_2._8_8_ =
         std::__cxx11::string::find((string *)(token.field_2._M_local_buf + 8),(ulong)local_210);
    while (uVar1 = vertex_spacing_string.field_2._8_8_, vertex_spacing_string.field_2._8_8_ != -1) {
      pcVar7 = (char *)std::__cxx11::string::length();
      std::__cxx11::string::c_str();
      psVar8 = (string *)
               std::__cxx11::string::replace((ulong)((long)&token.field_2 + 8),uVar1,pcVar7);
      std::__cxx11::string::operator=((string *)(token.field_2._M_local_buf + 8),psVar8);
      vertex_spacing_string.field_2._8_8_ =
           std::__cxx11::string::find((string *)(token.field_2._M_local_buf + 8),(ulong)local_210);
    }
    vs_body = (char *)std::__cxx11::string::c_str();
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,p_Stack_20->tes_id,1,&vs_body);
    dVar4 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar4,"glShaderSource() failed for tessellation evaluation shader object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xd6a);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string((string *)(token.field_2._M_local_buf + 8));
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)(te_body_string.field_2._M_local_buf + 8));
  }
  local_280 = "${VERSION}\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,p_Stack_20->vs_id,1,&local_280);
  dVar4 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar4,"glShaderSource() failed for vertex shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd76);
  n_shader = p_Stack_20->fs_id;
  n_shaders = p_Stack_20->tcs_id;
  shaders[0] = p_Stack_20->tes_id;
  shaders[1] = p_Stack_20->vs_id;
  compile_status = 4;
  for (shader = 0; shader < 4; shader = shader + 1) {
    local_2a4 = 0;
    local_2a8 = (&n_shader)[shader];
    if (local_2a8 != 0) {
      (**(code **)(fs_body + 0x248))(local_2a8);
      dVar4 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar4,"glCompileShader() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xd85);
      (**(code **)(fs_body + 0xa70))(local_2a8,0x8b81,&local_2a4);
      dVar4 = (**(code **)(fs_body + 0x800))();
      glu::checkError(dVar4,"glGetShaderiv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xd88);
      if (local_2a4 != 1) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_428,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_428,
                            (char (*) [39])"Compilation of shader object at index ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&shader);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])0x2a91386);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_428);
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"Shader compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xd8f);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
  }
  local_42c = 0;
  pcStack_448 = "result_tess_level_inner";
  varyings[0] = "result_tess_level_outer";
  (**(code **)(fs_body + 0x14c8))(p_Stack_20->po_id,2,&stack0xfffffffffffffbb8,0x8c8c);
  dVar4 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd9a);
  (**(code **)(fs_body + 0x10))(p_Stack_20->po_id,p_Stack_20->fs_id);
  (**(code **)(fs_body + 0x10))(p_Stack_20->po_id,p_Stack_20->vs_id);
  if (p_Stack_20->tcs_id != 0) {
    (**(code **)(fs_body + 0x10))(p_Stack_20->po_id,p_Stack_20->tcs_id);
  }
  if (p_Stack_20->tes_id != 0) {
    (**(code **)(fs_body + 0x10))(p_Stack_20->po_id,p_Stack_20->tes_id);
  }
  dVar4 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar4,"glAttachShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xda9);
  (**(code **)(fs_body + 0xce8))(p_Stack_20->po_id);
  dVar4 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar4,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdac);
  (**(code **)(fs_body + 0x9d8))(p_Stack_20->po_id,0x8b82,&local_42c);
  dVar4 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdaf);
  if (local_42c != 1) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Program linking failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
               ,0xdb3);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar5 = (**(code **)(fs_body + 0xb48))(p_Stack_20->po_id,"inner_tess_levels");
  p_Stack_20->inner_tess_levels_uniform_location = GVar5;
  GVar5 = (**(code **)(fs_body + 0xb48))(p_Stack_20->po_id,"outer_tess_levels");
  p_Stack_20->outer_tess_levels_uniform_location = GVar5;
  dVar4 = (**(code **)(fs_body + 0x800))();
  glu::checkError(dVar4,"glGetUniformLocation() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdba);
  return;
}

Assistant:

void TessellationShaderTCTEgl_TessLevel::initTestDescriptor(_tessellation_test_type				test_type,
															_test_descriptor*					out_test_ptr,
															_tessellation_shader_vertex_spacing vertex_spacing_mode)
{
	out_test_ptr->type			 = test_type;
	out_test_ptr->vertex_spacing = vertex_spacing_mode;

	/* Generate a program object we will later configure */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	out_test_ptr->po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Generate shader objects the test will use */
	out_test_ptr->fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	out_test_ptr->vs_id = gl.createShader(GL_VERTEX_SHADER);

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES || test_type == TESSELLATION_TEST_TYPE_TES)
	{
		out_test_ptr->tes_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	}

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		out_test_ptr->tcs_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(out_test_ptr->fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader object");

	/* Configure tessellation control shader */
	const char* tc_body = "${VERSION}\n"
						  "\n"
						  /* Required EXT_tessellation_shader functionality */
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (vertices = 4) out;\n"
						  "\n"
						  "uniform vec2 inner_tess_levels;\n"
						  "uniform vec4 outer_tess_levels;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_out           [gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
						  "    gl_TessLevelInner[0]                           = inner_tess_levels[0];\n"
						  "    gl_TessLevelInner[1]                           = inner_tess_levels[1];\n"
						  "    gl_TessLevelOuter[0]                           = outer_tess_levels[0];\n"
						  "    gl_TessLevelOuter[1]                           = outer_tess_levels[1];\n"
						  "    gl_TessLevelOuter[2]                           = outer_tess_levels[2];\n"
						  "    gl_TessLevelOuter[3]                           = outer_tess_levels[3];\n"
						  "}\n";

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		shaderSourceSpecialized(out_test_ptr->tcs_id, 1 /* count */, &tc_body);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader object");
	}

	/* Configure tessellation evaluation shader */
	const char* te_body = "${VERSION}\n"
						  "\n"
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (isolines, point_mode, VERTEX_SPACING_MODE) in;\n"
						  "\n"
						  "out vec2 result_tess_level_inner;\n"
						  "out vec4 result_tess_level_outer;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = gl_in[0].gl_Position;\n"
						  "\n"
						  "    result_tess_level_inner = vec2(gl_TessLevelInner[0],\n"
						  "                                   gl_TessLevelInner[1]);\n"
						  "    result_tess_level_outer = vec4(gl_TessLevelOuter[0],\n"
						  "                                   gl_TessLevelOuter[1],\n"
						  "                                   gl_TessLevelOuter[2],\n"
						  "                                   gl_TessLevelOuter[3]);\n"
						  "}\n";

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES || test_type == TESSELLATION_TEST_TYPE_TES)
	{
		/* Replace VERTEX_SPACING_MODE with the mode provided by the caller */
		std::stringstream te_body_stringstream;
		std::string		  te_body_string;
		const std::string token = "VERTEX_SPACING_MODE";
		std::size_t		  token_index;
		std::string		  vertex_spacing_string =
			TessellationShaderUtils::getESTokenForVertexSpacingMode(vertex_spacing_mode);

		te_body_stringstream << te_body;
		te_body_string = te_body_stringstream.str();

		token_index = te_body_string.find(token);

		while (token_index != std::string::npos)
		{
			te_body_string = te_body_string.replace(token_index, token.length(), vertex_spacing_string.c_str());

			token_index = te_body_string.find(token);
		}

		/* Set the shader source */
		const char* te_body_string_raw = te_body_string.c_str();

		shaderSourceSpecialized(out_test_ptr->tes_id, 1 /* count */, &te_body_string_raw);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader object");
	}

	/* Configure vertex shader */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n"
						  "}\n";

	shaderSourceSpecialized(out_test_ptr->vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader object");

	/* Compile all shaders of our interest */
	const glw::GLuint shaders[] = { out_test_ptr->fs_id, out_test_ptr->tcs_id, out_test_ptr->tes_id,
									out_test_ptr->vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLint  compile_status = GL_FALSE;
		glw::GLuint shader		   = shaders[n_shader];

		if (shader != 0)
		{
			gl.compileShader(shader);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

			if (compile_status != GL_TRUE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Compilation of shader object at index " << n_shader
								   << " failed." << tcu::TestLog::EndMessage;

				TCU_FAIL("Shader compilation failed");
			}
		} /* if (shader != 0) */
	}	 /* for (all shaders) */

	/* Attach the shaders to the test program object, set up XFB and then link the program */
	glw::GLint		   link_status = GL_FALSE;
	const char*		   varyings[]  = { "result_tess_level_inner", "result_tess_level_outer" };
	const unsigned int n_varyings  = sizeof(varyings) / sizeof(varyings[0]);

	gl.transformFeedbackVaryings(out_test_ptr->po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");

	gl.attachShader(out_test_ptr->po_id, out_test_ptr->fs_id);
	gl.attachShader(out_test_ptr->po_id, out_test_ptr->vs_id);

	if (out_test_ptr->tcs_id != 0)
	{
		gl.attachShader(out_test_ptr->po_id, out_test_ptr->tcs_id);
	}

	if (out_test_ptr->tes_id != 0)
	{
		gl.attachShader(out_test_ptr->po_id, out_test_ptr->tes_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	gl.linkProgram(out_test_ptr->po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(out_test_ptr->po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Retrieve uniform locations */
	out_test_ptr->inner_tess_levels_uniform_location = gl.getUniformLocation(out_test_ptr->po_id, "inner_tess_levels");
	out_test_ptr->outer_tess_levels_uniform_location = gl.getUniformLocation(out_test_ptr->po_id, "outer_tess_levels");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call(s) failed");

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		DE_ASSERT(out_test_ptr->inner_tess_levels_uniform_location != -1);
		DE_ASSERT(out_test_ptr->outer_tess_levels_uniform_location != -1);
	}
}